

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall Game::Game(Game *this,size_t grid_width,size_t grid_height)

{
  mt19937 *__urng;
  uniform_int_distribution<int> *__param;
  uniform_int_distribution<int> *__param_00;
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  (this->snake).direction = kUp;
  (this->snake).speed = 0.1;
  (this->snake).size = 1;
  (this->snake).alive = true;
  (this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  iVar7 = (int)grid_width;
  (this->snake).grid_width = iVar7;
  iVar6 = (int)grid_height;
  (this->snake).grid_height = iVar6;
  (this->snake2).direction = kUp;
  (this->snake2).speed = 0.1;
  (this->snake2).size = 1;
  (this->snake2).alive = true;
  (this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->snake2).grid_width = iVar7;
  (this->snake2).grid_height = iVar6;
  std::random_device::random_device(&this->dev);
  uVar1 = std::random_device::_M_getval();
  __urng = &this->engine;
  uVar5 = (ulong)uVar1;
  __urng->_M_x[0] = uVar5;
  lVar4 = 0x283;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 0x282);
    *(ulong *)(&(this->snake).direction + lVar4 * 2) = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x4f2);
  (this->engine)._M_p = 0x270;
  __param = &this->random_w;
  (this->random_w)._M_param._M_a = 0;
  (this->random_w)._M_param._M_b = iVar7;
  (this->random_h)._M_param._M_a = 0;
  (this->random_h)._M_param._M_b = iVar6;
  this->score = 0;
  rVar2 = std::uniform_int_distribution<int>::operator()(__param,__urng,&__param->_M_param);
  __param_00 = &this->random_h;
  rVar3 = std::uniform_int_distribution<int>::operator()(__param_00,__urng,&__param_00->_M_param);
  (this->snake).head_x = (float)rVar2;
  (this->snake).head_y = (float)rVar3;
  rVar2 = std::uniform_int_distribution<int>::operator()(__param,__urng,&__param->_M_param);
  rVar3 = std::uniform_int_distribution<int>::operator()(__param_00,__urng,&__param_00->_M_param);
  (this->snake2).head_x = (float)rVar2;
  (this->snake2).head_y = (float)rVar3;
  PlaceFood(this);
  return;
}

Assistant:

Game::Game(std::size_t grid_width, std::size_t grid_height)
    : snake(grid_width, grid_height),
	  snake2(grid_width, grid_height),
      engine(dev()),
      random_w(0, static_cast<int>(grid_width)),
      random_h(0, static_cast<int>(grid_height)) 
{
  snake.setPosition(random_w(engine),random_h(engine));
  snake2.setPosition(random_w(engine),random_h(engine));
  PlaceFood();
}